

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  BPMNode *pBVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  BPMNode **ppBVar7;
  
  uVar3 = lists->nextfree;
  if (lists->numfree <= uVar3) {
    lVar2 = (ulong)lists->memsize * 0x18;
    for (lVar4 = 0; lVar2 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
      *(undefined4 *)((long)&lists->memory->in_use + lVar4) = 0;
    }
    uVar3 = lists->listsize;
    for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      ppBVar7 = lists->chains0 + uVar5;
      while (pBVar1 = *ppBVar7, pBVar1 != (BPMNode *)0x0) {
        pBVar1->in_use = 1;
        ppBVar7 = &pBVar1->tail;
      }
      ppBVar7 = lists->chains1 + uVar5;
      while (pBVar1 = *ppBVar7, pBVar1 != (BPMNode *)0x0) {
        pBVar1->in_use = 1;
        ppBVar7 = &pBVar1->tail;
      }
    }
    lists->numfree = 0;
    uVar3 = 0;
    uVar6 = 0;
    for (lVar4 = 0; lVar2 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
      if (*(int *)((long)&lists->memory->in_use + lVar4) == 0) {
        uVar5 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        lists->numfree = uVar6;
        lists->freelist[uVar5] = (BPMNode *)((long)&lists->memory->weight + lVar4);
      }
    }
  }
  lists->nextfree = uVar3 + 1;
  pBVar1 = lists->freelist[uVar3];
  pBVar1->weight = weight;
  pBVar1->index = index;
  pBVar1->tail = tail;
  return pBVar1;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail)
{
  unsigned i;
  BPMNode* result;

  /*memory full, so garbage collect*/
  if(lists->nextfree >= lists->numfree)
  {
    /*mark only those that are in use*/
    for(i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
    for(i = 0; i != lists->listsize; ++i)
    {
      BPMNode* node;
      for(node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
      for(node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
    }
    /*collect those that are free*/
    lists->numfree = 0;
    for(i = 0; i != lists->memsize; ++i)
    {
      if(!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
    }
    lists->nextfree = 0;
  }

  result = lists->freelist[lists->nextfree++];
  result->weight = weight;
  result->index = index;
  result->tail = tail;
  return result;
}